

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O0

TYPE_ID __thiscall
TypesHierarchy::AddCompisite
          (TypesHierarchy *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *tmptypes)

{
  bool bVar1;
  reference __x;
  size_type sVar2;
  reference __x_00;
  ulong local_78;
  size_t i;
  _Self local_58;
  _Base_ptr local_50;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmprow;
  iterator it_type;
  TYPE_ID newType;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *tmptypes_local;
  TypesHierarchy *this_local;
  
  std::_Rb_tree_const_iterator<unsigned_int>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<unsigned_int> *)
             &tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  local_50 = (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (tmptypes);
  tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_50;
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (tmptypes);
    bVar1 = std::operator!=((_Self *)&tmprow.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58);
    if (!bVar1) break;
    __x = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                    ((_Rb_tree_const_iterator<unsigned_int> *)
                     &tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,__x);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)
               &tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0);
  }
  if (this->CompositeStartFrom != 0) {
    for (local_78 = (ulong)this->CompositeStartFrom;
        sVar2 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::size(&this->types), local_78 <= sVar2; local_78 = local_78 + 1) {
      __x_00 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->types,local_78);
      bVar1 = std::operator==(__x_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48
                             );
      if (bVar1) {
        this_local._4_4_ = (TYPE_ID)local_78;
        goto LAB_001c70b4;
      }
    }
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back(&this->types,(value_type *)local_48);
  sVar2 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(&this->types);
  this_local._4_4_ = (int)sVar2 - 1;
  if (this->CompositeStartFrom == 0) {
    this->CompositeStartFrom = this_local._4_4_;
  }
LAB_001c70b4:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return this_local._4_4_;
}

Assistant:

TYPE_ID TypesHierarchy::AddCompisite(set<TYPE_ID>* tmptypes) {
	TYPE_ID newType;
	set <TYPE_ID>::iterator it_type;
	vector<TYPE_ID> tmprow;

	for ( it_type = tmptypes->begin(); it_type != tmptypes->end(); it_type++)
		tmprow.push_back(*it_type);


	if (CompositeStartFrom != 0)
		for ( size_t i = CompositeStartFrom; i <= types.size(); i++)
			if( types[i] == tmprow ) return i;


	types.push_back(tmprow);
	newType = types.size()-1;

	if (CompositeStartFrom == 0) CompositeStartFrom = newType;
	return newType;
}